

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O1

int ASN1_TIME_print(BIO *fp,ASN1_TIME *a)

{
  int iVar1;
  uint uVar2;
  tm tStack_58;
  CBS CStack_20;
  
  if (a->type == 0x18) {
    CStack_20.data = a->data;
    CStack_20.len = (size_t)a->length;
    uVar2 = 0;
    iVar1 = CBS_parse_generalized_time(&CStack_20,&tStack_58,0);
    if (iVar1 == 0) {
      BIO_puts(fp,"Bad time value");
    }
    else {
      iVar1 = BIO_printf(fp,"%s %2d %02d:%02d:%02d %d GMT",mon[tStack_58.tm_mon],
                         (ulong)(uint)tStack_58.tm_mday,(ulong)(uint)tStack_58.tm_hour,
                         (ulong)(uint)tStack_58.tm_min,(ulong)(uint)tStack_58.tm_sec,
                         (ulong)(tStack_58.tm_year + 0x76c));
      uVar2 = (uint)(0 < iVar1);
    }
    return uVar2;
  }
  if (a->type != 0x17) {
    BIO_puts(fp,"Bad time value");
    return 0;
  }
  CStack_20.data = a->data;
  CStack_20.len = (size_t)a->length;
  uVar2 = 0;
  iVar1 = CBS_parse_utc_time(&CStack_20,&tStack_58,0);
  if (iVar1 == 0) {
    BIO_puts(fp,"Bad time value");
  }
  else {
    iVar1 = BIO_printf(fp,"%s %2d %02d:%02d:%02d %d GMT",mon[tStack_58.tm_mon],
                       (ulong)(uint)tStack_58.tm_mday,(ulong)(uint)tStack_58.tm_hour,
                       (ulong)(uint)tStack_58.tm_min,(ulong)(uint)tStack_58.tm_sec,
                       (ulong)(tStack_58.tm_year + 0x76c));
    uVar2 = (uint)(0 < iVar1);
  }
  return uVar2;
}

Assistant:

int ASN1_TIME_print(BIO *bp, const ASN1_TIME *tm) {
  if (tm->type == V_ASN1_UTCTIME) {
    return ASN1_UTCTIME_print(bp, tm);
  }
  if (tm->type == V_ASN1_GENERALIZEDTIME) {
    return ASN1_GENERALIZEDTIME_print(bp, tm);
  }
  BIO_puts(bp, "Bad time value");
  return 0;
}